

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O3

void __thiscall Simplex::unboundedDebug(Simplex *this)

{
  longdouble lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 in_R9;
  ulong uVar5;
  longdouble lVar6;
  
  fwrite("Unbounded:\n",0xb,1,_stderr);
  printObjective(this);
  fprintf(_stderr,"Pivot row = %d\n",(ulong)(uint)this->pivot_row);
  lVar6 = this->rhs[this->pivot_row];
  fprintf(_stderr,"RHS = %.3Lf\n");
  fwrite("Row: ",5,1,_stderr);
  iVar2 = this->n;
  iVar3 = this->m;
  if (iVar3 + iVar2 != 0 && SCARRY4(iVar3,iVar2) == iVar3 + iVar2 < 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      lVar1 = *(longdouble *)((long)this->row + lVar4);
      if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
        fprintf(_stderr,"%d:",uVar5 & 0xffffffff);
        lVar6 = *(longdouble *)((long)this->obj + lVar4);
        fprintf(_stderr,"%.3Lf/%.3Lf, ");
        iVar2 = this->n;
        iVar3 = this->m;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while ((long)uVar5 < (long)(iVar3 + iVar2));
  }
  if (0 < iVar2) {
    uVar5 = 0;
    do {
      fprintf(_stderr,"%d:%d %d, ",uVar5 & 0xffffffff,(ulong)(uint)this->lb[uVar5].v,
              (ulong)(uint)this->ub[uVar5].v,in_R9,lVar6);
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)this->n);
  }
  return;
}

Assistant:

void Simplex::unboundedDebug() const {
	fprintf(stderr, "Unbounded:\n");
	printObjective();
	//		printTableau(true);
	fprintf(stderr, "Pivot row = %d\n", pivot_row);
	fprintf(stderr, "RHS = %.3Lf\n", rhs[pivot_row]);
	fprintf(stderr, "Row: ");
	for (int i = 0; i < n + m; i++) {
		if (row[i] == 0) {
			continue;
		}
		fprintf(stderr, "%d:", i);
		fprintf(stderr, "%.3Lf/%.3Lf, ", obj[i], row[i]);
	}
	for (int i = 0; i < n; i++) {
		fprintf(stderr, "%d:%d %d, ", i, (int)lb[i], (int)ub[i]);
	}
}